

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_unpack(exr_context_t ctxt,exr_attr_opaquedata_t *u,int32_t *sz,void **unpacked)

{
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  void *tmpuptr;
  int32_t tmpusz;
  exr_result_t rv;
  undefined8 local_38;
  undefined4 local_30 [2];
  undefined8 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = 0;
    }
    if (in_RSI == (undefined4 *)0x0) {
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,3,"Invalid reference to opaque data object to initialize");
    }
    else if (*(long *)(in_RSI + 6) == 0) {
      if (*(long *)(in_RSI + 8) == 0) {
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,"No unpack provider specified for opaque data");
      }
      else {
        local_28 = in_RCX;
        local_20 = in_RDX;
        local_18 = in_RSI;
        local_4 = (**(code **)(in_RSI + 8))
                            (in_RDI,*(undefined8 *)(in_RSI + 4),*in_RSI,local_30,&local_38);
        if (local_4 == 0) {
          local_18[1] = local_30[0];
          *(undefined8 *)(local_18 + 6) = local_38;
          if (local_20 != (undefined4 *)0x0) {
            *local_20 = local_30[0];
          }
          if (local_28 != (undefined8 *)0x0) {
            *local_28 = local_38;
          }
        }
      }
    }
    else {
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = in_RSI[1];
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = *(undefined8 *)(in_RSI + 6);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_unpack (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, int32_t* sz, void** unpacked)
{
    exr_result_t rv;
    int32_t      tmpusz;
    void*        tmpuptr;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sz) *sz = 0;
    if (unpacked) *unpacked = NULL;

    if (!u)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (u->unpacked_data)
    {
        if (sz) *sz = u->unpacked_size;
        if (unpacked) *unpacked = u->unpacked_data;
        return EXR_ERR_SUCCESS;
    }

    if (!u->unpack_func_ptr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No unpack provider specified for opaque data");
    rv = u->unpack_func_ptr (
        ctxt, u->packed_data, u->size, &(tmpusz), &(tmpuptr));
    if (rv == EXR_ERR_SUCCESS)
    {
        u->unpacked_size = tmpusz;
        u->unpacked_data = tmpuptr;
        if (sz) *sz = tmpusz;
        if (unpacked) *unpacked = tmpuptr;
    }

    return rv;
}